

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmemory.cpp
# Opt level: O1

SHMPTR SHMWStrDup(LPCWSTR string)

{
  size_t sVar1;
  SHMPTR shmptr;
  LPVOID __dest;
  ulong size;
  
  if (string != (LPCWSTR)0x0) {
    sVar1 = PAL_wcslen(string);
    size = (ulong)((int)sVar1 * 2 + 2);
    shmptr = SHMalloc(size);
    if (shmptr != 0) {
      __dest = SHMPtrToPtr(shmptr);
      if (__dest != (LPVOID)0x0) {
        memcpy(__dest,string,size);
        return shmptr;
      }
      fprintf(_stderr,"] %s %s:%d","SHMWStrDup",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/shmemory/shmemory.cpp"
              ,0x530);
      fprintf(_stderr,"Expression: ptr != NULL, Description: SHMPTR_TO_PTR returned NULL.\n");
      SHMfree(shmptr);
    }
  }
  return 0;
}

Assistant:

SHMPTR SHMWStrDup( LPCWSTR string )
{
    UINT length = 0;
    SHMPTR retVal = 0;

    if ( string )
    {
        length = ( PAL_wcslen( string ) + 1 ) * sizeof( WCHAR );

        retVal = SHMalloc( length );

        if ( retVal != 0 )
        {
            LPVOID ptr = SHMPTR_TO_PTR(retVal);
            _ASSERT_MSG(ptr != NULL, "SHMPTR_TO_PTR returned NULL.\n");
            if (ptr != NULL)
            {
                memcpy( ptr, string, length );
            }
            else
            {
                // This code should never be reached. If a valid pointer
                // is passed to SHMPTR_TO_PTR and NULL is returned, then
                // there's a problem in either the macro, or the underlying
                // call to SHMPtrToPtr. In case the impossible happens,
                // though, free the memory and return NULL rather than
                // returning uninitialized memory.
                SHMfree( retVal );
                retVal = NULL;
            }
        }
    }
    return retVal;
}